

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Compaction * __thiscall leveldb::VersionSet::PickCompaction(VersionSet *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  Options *pOVar4;
  reference ppFVar5;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *in_RDI;
  undefined1 uVar6;
  InternalKey largest;
  InternalKey smallest;
  FileMetaData *f;
  size_t i;
  bool seek_compaction;
  bool size_compaction;
  int level;
  Compaction *c;
  Compaction *in_stack_000000d8;
  VersionSet *in_stack_000000e0;
  string *in_stack_ffffffffffffff38;
  Slice *in_stack_ffffffffffffff40;
  pointer *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  Options *in_stack_ffffffffffffff58;
  Compaction *in_stack_ffffffffffffff60;
  VersionSet *in_stack_ffffffffffffff70;
  Slice *in_stack_ffffffffffffff80;
  Slice *in_stack_ffffffffffffff88;
  InternalKeyComparator *in_stack_ffffffffffffff90;
  Slice in_stack_ffffffffffffffc0;
  value_type in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  Options *__n;
  undefined2 in_stack_ffffffffffffffe0;
  undefined1 uVar7;
  int iVar8;
  Compaction *local_18;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  uVar7 = 1.0 <= (double)in_RDI[0xf].
                         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[0x1b];
  uVar6 = in_RDI[0xf].
          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
          _M_impl.super__Vector_impl_data._M_start[0x19] != (FileMetaData *)0x0;
  if ((bool)uVar7) {
    iVar8 = *(int *)(in_RDI[0xf].
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x1c);
    local_18 = (Compaction *)operator_new(0x158);
    Compaction::Compaction(local_18,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    in_stack_ffffffffffffff58 = (Options *)0x0;
    in_stack_ffffffffffffff60 = local_18;
    while (__n = in_stack_ffffffffffffff58,
          pOVar4 = (Options *)
                   std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                   size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *
                        )(in_RDI[0xf].
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)iVar8 * 3 + 4)),
          in_stack_ffffffffffffff58 < pOVar4) {
      ppFVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)(in_RDI[0xf].
                               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + (long)iVar8 * 3 + 4),
                           (size_type)__n);
      in_stack_ffffffffffffffd0 = *ppFVar5;
      bVar1 = std::__cxx11::string::empty();
      in_stack_ffffffffffffff54 = CONCAT13(1,(int3)in_stack_ffffffffffffff54);
      if ((bVar1 & 1) == 0) {
        in_stack_ffffffffffffff48 =
             &in_RDI[2].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
        in_stack_ffffffffffffffc0 = InternalKey::Encode((InternalKey *)0x12c82b);
        Slice::Slice(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        iVar3 = InternalKeyComparator::Compare
                          (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                           in_stack_ffffffffffffff80);
        in_stack_ffffffffffffff54 = CONCAT13(0 < iVar3,(int3)in_stack_ffffffffffffff54);
      }
      if ((char)((uint)in_stack_ffffffffffffff54 >> 0x18) != '\0') {
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                  ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (value_type *)in_stack_ffffffffffffff48);
        break;
      }
      in_stack_ffffffffffffff58 = (Options *)((long)&__n->comparator + 1);
    }
    iVar3 = (int)((ulong)__n >> 0x20);
    bVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                      ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (bVar2) {
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 (in_RDI[0xf].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)iVar8 * 3 + 4),0);
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (value_type *)in_stack_ffffffffffffff48);
    }
  }
  else {
    if (!(bool)uVar6) {
      return (Compaction *)0x0;
    }
    iVar8 = *(int *)(in_RDI[0xf].
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x1a);
    local_18 = (Compaction *)operator_new(0x158);
    Compaction::Compaction
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (value_type *)in_stack_ffffffffffffff48);
  }
  local_18->input_version_ =
       (Version *)
       in_RDI[0xf].
       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl
       .super__Vector_impl_data._M_start;
  Version::Ref(local_18->input_version_);
  if (iVar8 == 0) {
    InternalKey::InternalKey((InternalKey *)0x12c9fa);
    InternalKey::InternalKey((InternalKey *)0x12ca04);
    GetRange(in_stack_ffffffffffffff70,in_RDI,(InternalKey *)in_stack_ffffffffffffff60,
             (InternalKey *)in_stack_ffffffffffffff58);
    Version::GetOverlappingInputs
              ((Version *)CONCAT44(iVar8,CONCAT13(uVar7,CONCAT12(uVar6,in_stack_ffffffffffffffe0))),
               iVar3,(InternalKey *)in_stack_ffffffffffffffd0,
               (InternalKey *)in_stack_ffffffffffffffc0.size_,
               (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               in_stack_ffffffffffffffc0.data_);
    InternalKey::~InternalKey((InternalKey *)0x12ca5d);
    InternalKey::~InternalKey((InternalKey *)0x12ca67);
  }
  SetupOtherInputs(in_stack_000000e0,in_stack_000000d8);
  return local_18;
}

Assistant:

Compaction* VersionSet::PickCompaction() {
  Compaction* c;
  int level;

  // We prefer compactions triggered by too much data in a level over
  // the compactions triggered by seeks.
  const bool size_compaction = (current_->compaction_score_ >= 1);
  const bool seek_compaction = (current_->file_to_compact_ != nullptr);
  if (size_compaction) {
    level = current_->compaction_level_;
    assert(level >= 0);
    assert(level + 1 < config::kNumLevels);
    c = new Compaction(options_, level);

    // Pick the first file that comes after compact_pointer_[level]
    for (size_t i = 0; i < current_->files_[level].size(); i++) {
      FileMetaData* f = current_->files_[level][i];
      if (compact_pointer_[level].empty() ||
          icmp_.Compare(f->largest.Encode(), compact_pointer_[level]) > 0) {
        c->inputs_[0].push_back(f);
        break;
      }
    }
    if (c->inputs_[0].empty()) {
      // Wrap-around to the beginning of the key space
      c->inputs_[0].push_back(current_->files_[level][0]);
    }
  } else if (seek_compaction) {
    level = current_->file_to_compact_level_;
    c = new Compaction(options_, level);
    c->inputs_[0].push_back(current_->file_to_compact_);
  } else {
    return nullptr;
  }

  c->input_version_ = current_;
  c->input_version_->Ref();

  // Files in level 0 may overlap each other, so pick up all overlapping ones
  if (level == 0) {
    InternalKey smallest, largest;
    GetRange(c->inputs_[0], &smallest, &largest);
    // Note that the next call will discard the file we placed in
    // c->inputs_[0] earlier and replace it with an overlapping set
    // which will include the picked file.
    current_->GetOverlappingInputs(0, &smallest, &largest, &c->inputs_[0]);
    assert(!c->inputs_[0].empty());
  }

  SetupOtherInputs(c);

  return c;
}